

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_reader.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  char cVar2;
  KernelExecutionType KVar3;
  size_t __n;
  pointer __s2;
  KernelPerformanceInfo *pKVar4;
  uint64_t uVar5;
  pointer ppKVar6;
  pointer __last;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  FILE *__stream;
  KernelPerformanceInfo *pKVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  undefined8 extraout_RAX;
  char *pcVar15;
  ulong uVar16;
  int iVar17;
  char *pcVar18;
  char *__end;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double local_b0;
  double local_a8;
  vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  kernelInfo;
  ulong local_80;
  pointer local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  KernelPerformanceInfo *new_kernel;
  double fileExecuteTime;
  long local_40;
  iterator local_38;
  
  if (argc == 1) {
    main_cold_1();
    if (kernelInfo.
        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(kernelInfo.
                      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)kernelInfo.
                            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)kernelInfo.
                            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (argc < 2) {
    local_80 = 0x20;
    bVar19 = true;
    iVar9 = 1;
  }
  else {
    iVar9 = 1;
    iVar10 = 0;
    cVar2 = ' ';
    do {
      pcVar15 = argv[iVar9];
      if (*pcVar15 != '-') break;
      iVar8 = strcmp(pcVar15,"--delimiter");
      iVar17 = iVar9;
      if (iVar8 == 0) {
        iVar17 = iVar9 + 1;
        pcVar15 = argv[(long)iVar9 + 1];
        cVar2 = *pcVar15;
      }
      iVar9 = strcmp(pcVar15,"--fixed-width");
      if (iVar9 == 0) {
        lVar11 = (long)iVar17;
        iVar17 = iVar17 + 1;
        iVar10 = atoi(argv[lVar11 + 1]);
      }
      iVar9 = iVar17 + 1;
    } while (iVar9 < argc);
    bVar19 = iVar10 == 0;
    local_80 = (ulong)(uint)(int)cVar2;
  }
  kernelInfo.
  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  kernelInfo.
  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  kernelInfo.
  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar9 < argc) {
    lVar11 = (long)iVar9;
    local_a8 = 0.0;
    do {
      local_40 = lVar11;
      __stream = fopen(argv[lVar11],"rb");
      fileExecuteTime = 0.0;
      fread(&fileExecuteTime,8,1,__stream);
      local_a8 = local_a8 + fileExecuteTime;
LAB_001024d3:
      iVar9 = feof(__stream);
      if (iVar9 == 0) {
        pKVar12 = (KernelPerformanceInfo *)operator_new(0x48);
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
        paVar13 = &(pKVar12->kernelName).field_2;
        (pKVar12->kernelName)._M_dataplus._M_p = (pointer)paVar13;
        if (local_70 == &local_60) {
          paVar13->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
          *(undefined8 *)((long)&(pKVar12->kernelName).field_2 + 8) = uStack_58;
        }
        else {
          (pKVar12->kernelName)._M_dataplus._M_p = local_70;
          (pKVar12->kernelName).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
        }
        (pKVar12->kernelName)._M_string_length = local_68;
        local_68 = 0;
        local_60 = '\0';
        pKVar12->timeSq = 0.0;
        pKVar12->startTime = 0.0;
        pKVar12->callCount = 0;
        pKVar12->time = 0.0;
        pKVar12->kType = PARALLEL_FOR;
        local_70 = &local_60;
        new_kernel = pKVar12;
        bVar7 = KokkosTools::KernelTimer::KernelPerformanceInfo::readFromFile
                          (pKVar12,(FILE *)__stream);
        pKVar12 = new_kernel;
        ppKVar6 = kernelInfo.
                  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((bVar7) && (__n = (new_kernel->kernelName)._M_string_length, __n != 0)) {
          local_38._M_current =
               kernelInfo.
               super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          lVar11 = (long)kernelInfo.
                         super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)kernelInfo.
                         super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar11 != 0) {
            __s2 = (new_kernel->kernelName)._M_dataplus._M_p;
            uVar14 = 0;
            do {
              pKVar4 = ppKVar6[uVar14];
              if (((pKVar4->kernelName)._M_string_length == __n) &&
                 (iVar9 = bcmp((pKVar4->kernelName)._M_dataplus._M_p,__s2,__n), iVar9 == 0)) {
                if (-1 < (int)uVar14) {
                  pKVar4 = ppKVar6[uVar14];
                  dVar1 = pKVar12->time;
                  pKVar4->time = pKVar4->time + dVar1;
                  pKVar4->timeSq = dVar1 * dVar1 + pKVar4->timeSq;
                  pKVar4->callCount = pKVar4->callCount + pKVar12->callCount;
                  goto LAB_001024d3;
                }
                break;
              }
              uVar14 = (ulong)((int)uVar14 + 1);
            } while (uVar14 < (ulong)(lVar11 >> 3));
          }
          if (local_38._M_current ==
              kernelInfo.
              super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>
            ::_M_realloc_insert<KokkosTools::KernelTimer::KernelPerformanceInfo*const&>
                      ((vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>
                        *)&kernelInfo,local_38,&new_kernel);
          }
          else {
            *local_38._M_current = pKVar12;
            kernelInfo.
            super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 kernelInfo.
                 super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        goto LAB_001024d3;
      }
      fclose(__stream);
      __last = kernelInfo.
               super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppKVar6 = kernelInfo.
                super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = local_40 + 1;
    } while ((int)lVar11 != argc);
    if (kernelInfo.
        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        kernelInfo.
        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar14 = (long)kernelInfo.
                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)kernelInfo.
                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar11 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>>
                ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  )kernelInfo.
                   super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  )kernelInfo.
                   super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(KokkosTools::KernelTimer::KernelPerformanceInfo_*,_KokkosTools::KernelTimer::KernelPerformanceInfo_*)>
                  )0x102c37);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>>
                ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  )ppKVar6,
                 (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  )__last,(_Iter_comp_iter<bool_(*)(KokkosTools::KernelTimer::KernelPerformanceInfo_*,_KokkosTools::KernelTimer::KernelPerformanceInfo_*)>
                           )0x102c37);
    }
    if ((long)kernelInfo.
              super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)kernelInfo.
              super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      local_b0 = 0.0;
      uVar14 = 0;
      lVar11 = 0;
      do {
        pKVar12 = kernelInfo.
                  super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar14];
        if (pKVar12->kType != REGION) {
          local_b0 = local_b0 + pKVar12->time;
          lVar11 = lVar11 + pKVar12->callCount;
        }
        uVar14 = uVar14 + 1;
      } while ((uVar14 & 0xffffffff) <
               (ulong)((long)kernelInfo.
                             super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)kernelInfo.
                             super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
      goto LAB_0010273a;
    }
  }
  else {
    local_a8 = 0.0;
  }
  lVar11 = 0;
  local_b0 = 0.0;
LAB_0010273a:
  printf(
        " (Type)   Total Time, Call Count, Avg. Time per Call, %%Total Time in Kernels, %%Total Program Time\n"
        );
  puts("-------------------------------------------------------------------------\n");
  puts("Regions: \n");
  if (kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    uVar16 = 1;
    do {
      pKVar12 = kernelInfo.
                super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14];
      if (pKVar12->kType == REGION) {
        uVar5 = pKVar12->callCount;
        auVar20._8_4_ = (int)(uVar5 >> 0x20);
        auVar20._0_8_ = uVar5;
        auVar20._12_4_ = 0x45300000;
        dVar1 = pKVar12->time;
        if (bVar19) {
          pcVar18 = "- %s\n%s%c%f%c%lu%c%f%c%f%c%f\n";
          pcVar15 = " (REGION)  ";
        }
        else {
          pcVar18 = "- %100s\n%11s%c%15.5f%c%12lu%c%15.5f%c%7.3f%c%7.3f\n";
          pcVar15 = " (Region)  ";
        }
        printf(pcVar18,dVar1,
               dVar1 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)),
               (dVar1 / local_b0) * 100.0,(dVar1 / local_a8) * 100.0,
               (pKVar12->kernelName)._M_dataplus._M_p,pcVar15,local_80,local_80,uVar5,local_80,
               local_80,local_80);
      }
      bVar7 = uVar16 < (ulong)((long)kernelInfo.
                                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)kernelInfo.
                                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar14 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar7);
  }
  putchar(10);
  puts("-------------------------------------------------------------------------");
  puts("Kernels: \n");
  if (kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    uVar16 = 1;
    do {
      pKVar12 = kernelInfo.
                super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14];
      uVar5 = pKVar12->callCount;
      auVar21._8_4_ = (int)(uVar5 >> 0x20);
      auVar21._0_8_ = uVar5;
      auVar21._12_4_ = 0x45300000;
      KVar3 = pKVar12->kType;
      if (KVar3 != REGION) {
        if (bVar19) {
          pcVar15 = " (ParFor)  ";
          if (KVar3 != PARALLEL_FOR) {
            if (KVar3 == PARALLEL_REDUCE) {
              pcVar15 = " (ParRed)  ";
            }
            else {
              pcVar15 = " (REGION)  ";
              if (KVar3 == PARALLEL_SCAN) {
                pcVar15 = " (ParScan) ";
              }
            }
          }
          dVar1 = pKVar12->time;
          pcVar18 = "- %s\n%s%c%f%c%lu%c%f%c%f%c%f\n";
        }
        else {
          pcVar15 = " (ParFor)  ";
          if (KVar3 != PARALLEL_FOR) {
            if (KVar3 == PARALLEL_REDUCE) {
              pcVar15 = " (ParRed)  ";
            }
            else {
              pcVar15 = " (Region)  ";
              if (KVar3 == PARALLEL_SCAN) {
                pcVar15 = " (ParScan) ";
              }
            }
          }
          dVar1 = pKVar12->time;
          pcVar18 = "- %100s\n%11s%c%15.5f%c%12lu%c%15.5f%c%7.3f%c%7.3f\n";
        }
        printf(pcVar18,dVar1,
               dVar1 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)),
               (dVar1 / local_b0) * 100.0,(dVar1 / local_a8) * 100.0,
               (pKVar12->kernelName)._M_dataplus._M_p,pcVar15,local_80,local_80,uVar5,local_80,
               local_80,local_80);
      }
      bVar7 = uVar16 < (ulong)((long)kernelInfo.
                                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)kernelInfo.
                                     super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar14 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar7);
  }
  putchar(10);
  puts("-------------------------------------------------------------------------");
  puts("Summary:");
  putchar(10);
  printf("Total Execution Time (incl. Kokkos + non-Kokkos):      %20.5f seconds\n",local_a8);
  printf("Total Time in Kokkos kernels:                          %20.5f seconds\n",local_b0);
  printf("   -> Time outside Kokkos kernels:                     %20.5f seconds\n",
         local_a8 - local_b0);
  printf("   -> Percentage in Kokkos kernels:                    %20.2f %%\n",
         (local_b0 / local_a8) * 100.0);
  printf("Total Calls to Kokkos Kernels:                         %20lu\n",lVar11);
  putchar(10);
  puts("-------------------------------------------------------------------------");
  if (kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(kernelInfo.
                    super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)kernelInfo.
                          super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)kernelInfo.
                          super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc == 1) {
    fprintf(stderr, "Did you specify any data files on the command line!\n");
    fprintf(stderr, "Usage: ./reader file1.dat [fileX.dat]*\n");
    exit(-1);
  }

  char delimiter  = ' ';
  int fixed_width = 0;

  int commandline_args = 1;
  while ((commandline_args < argc) && (argv[commandline_args][0] == '-')) {
    if (strcmp(argv[commandline_args], "--delimiter") == 0) {
      delimiter = argv[++commandline_args][0];
    }
    if (strcmp(argv[commandline_args], "--fixed-width") == 0) {
      fixed_width = atoi(argv[++commandline_args]);
    }

    commandline_args++;
  }

  std::vector<KernelPerformanceInfo*> kernelInfo;
  double totalKernelsTime    = 0;
  double totalExecuteTime    = 0;
  uint64_t totalKernelsCalls = 0;

  for (int i = commandline_args; i < argc; i++) {
    FILE* the_file = fopen(argv[i], "rb");

    double fileExecuteTime = 0;
    fread(&fileExecuteTime, sizeof(fileExecuteTime), 1, the_file);

    totalExecuteTime += fileExecuteTime;

    while (!feof(the_file)) {
      KernelPerformanceInfo* new_kernel =
          new KernelPerformanceInfo("", PARALLEL_FOR);
      if (new_kernel->readFromFile(the_file)) {
        if (!new_kernel->getName().empty()) {
          int kernelIndex = find_index(kernelInfo, new_kernel->getName());

          if (kernelIndex > -1) {
            kernelInfo[kernelIndex]->addTime(new_kernel->getTime());
            kernelInfo[kernelIndex]->addCallCount(new_kernel->getCallCount());
          } else {
            kernelInfo.push_back(new_kernel);
          }
        }
      }
    }

    fclose(the_file);
  }

  std::sort(kernelInfo.begin(), kernelInfo.end(), compareKernelPerformanceInfo);

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    if (kernelInfo[i]->getKernelType() != REGION) {
      totalKernelsTime += kernelInfo[i]->getTime();
      totalKernelsCalls += kernelInfo[i]->getCallCount();
    }
  }

  printf(
      " (Type)   Total Time, Call Count, Avg. Time per Call, %%Total Time in "
      "Kernels, %%Total Program Time\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n\n");

  printf("Regions: \n\n");

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    const double callCountDouble = (double)kernelInfo[i]->getCallCount();

    if (kernelInfo[i]->getKernelType() != REGION) continue;
    if (fixed_width)
      printf("- %100s\n%11s%c%15.5f%c%12" PRIu64 "%c%15.5f%c%7.3f%c%7.3f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (Region)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
    else
      printf("- %s\n%s%c%f%c%" PRIu64 "%c%f%c%f%c%f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (REGION)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
  }

  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");
  printf("Kernels: \n\n");

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    const double callCountDouble = (double)kernelInfo[i]->getCallCount();

    if (kernelInfo[i]->getKernelType() == REGION) continue;
    if (fixed_width)
      printf("- %100s\n%11s%c%15.5f%c%12" PRIu64 "%c%15.5f%c%7.3f%c%7.3f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (Region)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
    else
      printf("- %s\n%s%c%f%c%" PRIu64 "%c%f%c%f%c%f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (REGION)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
  }

  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");
  printf("Summary:\n");
  printf("\n");
  printf(
      "Total Execution Time (incl. Kokkos + non-Kokkos):      %20.5f seconds\n",
      totalExecuteTime);
  printf(
      "Total Time in Kokkos kernels:                          %20.5f seconds\n",
      totalKernelsTime);
  printf(
      "   -> Time outside Kokkos kernels:                     %20.5f seconds\n",
      (totalExecuteTime - totalKernelsTime));
  printf("   -> Percentage in Kokkos kernels:                    %20.2f %%\n",
         (totalKernelsTime / totalExecuteTime) * 100);
  printf("Total Calls to Kokkos Kernels:                         %20" PRIu64
         "\n",
         totalKernelsCalls);
  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");

  return 0;
}